

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testInit
          (UniformBlockMemberOverlappingOffsetsTest *this)

{
  int iVar1;
  GLuint GVar2;
  GLuint b;
  GLuint GVar3;
  GLuint GVar4;
  Type TVar5;
  undefined1 local_10c [8];
  testCase test_case;
  testCase test_case_2;
  testCase test_case_1;
  GLuint stage_1;
  GLuint man_before_off;
  GLuint man_before_start;
  GLuint man_after_off;
  GLuint man_after_start;
  GLuint boy_offset;
  GLuint man_size;
  GLuint man_align;
  GLuint local_78;
  Type local_6c;
  Type *local_60;
  Type *man_type;
  GLuint j;
  GLuint boy_size;
  GLuint local_48;
  Type local_3c;
  Type *local_30;
  Type *boy_type;
  uint local_20;
  GLuint i;
  GLuint stage;
  undefined1 auStack_14 [2];
  bool stage_support [6];
  GLuint n_types;
  UniformBlockMemberOverlappingOffsetsTest *this_local;
  
  unique0x100002ca = this;
  _auStack_14 = TestBase::getTypesNumber((TestBase *)this);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    iVar1 = (*(this->super_NegativeTestBase).super_TestBase.super_TestCase.super_TestCase.
              super_TestNode._vptr_TestNode[0xc])(this,(ulong)local_20);
    *(byte *)((long)&i + (ulong)local_20 + 2) = (byte)iVar1 & 1;
  }
  for (boy_type._4_4_ = 0; boy_type._4_4_ < _auStack_14; boy_type._4_4_ = boy_type._4_4_ + 1) {
    TVar5 = TestBase::getType((TestBase *)this,boy_type._4_4_);
    _j = TVar5._0_8_;
    local_3c.m_basic_type = j;
    local_3c.m_n_columns = boy_size;
    local_48 = TVar5.m_n_rows;
    local_3c.m_n_rows = local_48;
    local_30 = &local_3c;
    _j = TVar5;
    man_type._4_4_ = Utils::Type::GetActualAlignment(local_30,1,false);
    for (man_type._0_4_ = 0; (uint)man_type < _auStack_14; man_type._0_4_ = (uint)man_type + 1) {
      TVar5 = TestBase::getType((TestBase *)this,(uint)man_type);
      _man_size = TVar5._0_8_;
      local_6c.m_basic_type = man_size;
      local_6c.m_n_columns = man_align;
      local_78 = TVar5.m_n_rows;
      local_6c.m_n_rows = local_78;
      local_60 = &local_6c;
      GVar2 = Utils::Type::GetBaseAlignment(local_60,false);
      b = Utils::Type::GetActualAlignment(local_60,1,false);
      GVar3 = lcm(this,man_type._4_4_,b);
      GVar4 = Utils::Type::GetActualOffset(GVar3 + 1,b);
      GVar2 = Utils::Type::GetActualOffset(GVar3 - GVar2,b);
      for (test_case_1.m_man_type.m_n_rows = 0; test_case_1.m_man_type.m_n_rows < 6;
          test_case_1.m_man_type.m_n_rows = test_case_1.m_man_type.m_n_rows + 1) {
        if ((*(byte *)((long)&i + (ulong)test_case_1.m_man_type.m_n_rows + 2) & 1) != 0) {
          if ((GVar2 < GVar3) && (GVar3 < GVar2 + b)) {
            test_case_2.m_stage = local_30->m_basic_type;
            unique0x00012004 = local_30->m_n_columns;
            test_case_2.m_man_type.m_n_rows = GVar3;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
            ::push_back(&this->m_test_cases,(value_type *)&test_case_2.m_man_type.m_n_rows);
          }
          if ((GVar3 < GVar4) && (GVar4 < GVar3 + man_type._4_4_)) {
            test_case.m_stage = local_30->m_basic_type;
            unique0x00012004 = local_30->m_n_columns;
            test_case_2.m_boy_type.m_basic_type = local_30->m_n_rows;
            test_case_2.m_boy_type.m_n_rows = local_60->m_basic_type;
            test_case_2.m_man_offset = local_60->m_n_columns;
            test_case_2.m_man_type.m_basic_type = local_60->m_n_rows;
            test_case_2.m_man_type.m_n_columns = test_case_1.m_man_type.m_n_rows;
            test_case.m_man_type.m_n_rows = GVar3;
            test_case_2.m_boy_type.m_n_columns = GVar4;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
            ::push_back(&this->m_test_cases,(value_type *)&test_case.m_man_type.m_n_rows);
          }
          local_10c._4_4_ = local_30->m_basic_type;
          unique0x00012004 = local_30->m_n_columns;
          test_case.m_boy_type.m_basic_type = local_30->m_n_rows;
          test_case.m_boy_type.m_n_rows = local_60->m_basic_type;
          test_case.m_man_offset = local_60->m_n_columns;
          test_case.m_man_type.m_basic_type = local_60->m_n_rows;
          test_case.m_man_type.m_n_columns = test_case_1.m_man_type.m_n_rows;
          local_10c._0_4_ = GVar3;
          test_case.m_boy_type.m_n_columns = GVar3;
          std::
          vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_10c);
        }
      }
    }
  }
  return;
}

Assistant:

void UniformBlockMemberOverlappingOffsetsTest::testInit()
{
	const GLuint n_types = getTypesNumber();
	bool		 stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& boy_type = getType(i);
		const GLuint	   boy_size = boy_type.GetActualAlignment(1 /* align */, false /* is_array*/);

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& man_type  = getType(j);
			const GLuint	   man_align = man_type.GetBaseAlignment(false);
			const GLuint	   man_size  = man_type.GetActualAlignment(1 /* align */, false /* is_array*/);

			const GLuint boy_offset		  = lcm(boy_size, man_size);
			const GLuint man_after_start  = boy_offset + 1;
			const GLuint man_after_off	= man_type.GetActualOffset(man_after_start, man_size);
			const GLuint man_before_start = boy_offset - man_align;
			const GLuint man_before_off   = man_type.GetActualOffset(man_before_start, man_size);

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				if ((boy_offset > man_before_off) && (boy_offset < man_before_off + man_size))
				{
					testCase test_case = { boy_offset, boy_type, man_before_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				if ((boy_offset < man_after_off) && (boy_offset + boy_size > man_after_off))
				{
					testCase test_case = { boy_offset, boy_type, man_after_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				/* Boy offset, should be fine for both types */
				testCase test_case = { boy_offset, boy_type, boy_offset, man_type, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}